

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SleepImpl.cpp
# Opt level: O0

void sf::priv::sleepImpl(Time time)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  timespec ti;
  Uint64 usecs;
  timespec local_20;
  ulong local_10;
  Time local_8;
  
  local_10 = Time::asMicroseconds(&local_8);
  local_20.tv_nsec = (local_10 % 1000000) * 1000;
  local_20.tv_sec = local_10 / 1000000;
  do {
    iVar1 = nanosleep(&local_20,&local_20);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return;
}

Assistant:

void sleepImpl(Time time)
{
    Uint64 usecs = time.asMicroseconds();

    // Construct the time to wait
    timespec ti;
    ti.tv_nsec = (usecs % 1000000) * 1000;
    ti.tv_sec = usecs / 1000000;

    // Wait...
    // If nanosleep returns -1, we check errno. If it is EINTR
    // nanosleep was interrupted and has set ti to the remaining
    // duration. We continue sleeping until the complete duration
    // has passed. We stop sleeping if it was due to an error.
    while ((nanosleep(&ti, &ti) == -1) && (errno == EINTR))
    {
    }
}